

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void tinygltf::SerializeGltfAnimationSampler(AnimationSampler *sampler,json *o)

{
  char cVar1;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  json *local_18;
  json *o_local;
  AnimationSampler *sampler_local;
  
  local_18 = o;
  o_local = (json *)sampler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"input",&local_39);
  SerializeNumberProperty<int>(&local_38,*(int *)o_local,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"output",&local_71);
  SerializeNumberProperty<int>(&local_70,*(int *)&o_local->field_0x4,local_18);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"interpolation",&local_99);
  SerializeStringProperty(&local_98,(string *)&o_local->m_value,local_18);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  cVar1 = Value::Type((Value *)&o_local[2].m_value);
  if (cVar1 != '\0') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c0,"extras",&local_c1);
    SerializeValue(&local_c0,(Value *)&o_local[2].m_value,local_18);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  }
  return;
}

Assistant:

static void SerializeGltfAnimationSampler(AnimationSampler &sampler, json &o) {
  SerializeNumberProperty("input", sampler.input, o);
  SerializeNumberProperty("output", sampler.output, o);
  SerializeStringProperty("interpolation", sampler.interpolation, o);

  if (sampler.extras.Type() != NULL_TYPE) {
    SerializeValue("extras", sampler.extras, o);
  }
}